

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlist.c
# Opt level: O0

void raviX_ptrlist_sort(PtrList **plist,void *userdata,_func_int_void_ptr_void_ptr_void_ptr *cmp)

{
  PtrList **ppPVar1;
  PtrList *l;
  int local_5c;
  int i;
  PtrList *newhead;
  PtrList *next;
  PtrList *block2;
  PtrList *block1;
  PtrList *pPStack_30;
  int blocks;
  PtrList *list;
  PtrList *head;
  _func_int_void_ptr_void_ptr_void_ptr *cmp_local;
  void *userdata_local;
  PtrList **plist_local;
  
  list = *plist;
  block1._4_4_ = 1;
  if (N_ != 7) {
    __assert_fail("N_ == LIST_NODE_NR",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ptrlist.c"
                  ,0x24a,
                  "void raviX_ptrlist_sort(PtrList **, void *, int (*)(void *, const void *, const void *))"
                 );
  }
  pPStack_30 = list;
  if (list == (PtrList *)0x0) {
    return;
  }
  do {
    array_sort(pPStack_30->list_,(int)(short)(char)*(undefined2 *)pPStack_30,userdata,cmp);
    verify_sorted(pPStack_30,1,userdata,cmp);
    ppPVar1 = &pPStack_30->next_;
    pPStack_30 = *ppPVar1;
  } while (*ppPVar1 != list);
  do {
    block2 = list;
    do {
      next = block2;
      for (local_5c = 0; local_5c < block1._4_4_; local_5c = local_5c + 1) {
        next = next->next_;
        if (next == list) {
          if (block2 == list) {
            *plist = list;
            return;
          }
          goto LAB_0010f476;
        }
      }
      newhead = next;
      local_5c = 0;
      do {
        if (block1._4_4_ <= local_5c) break;
        newhead = newhead->next_;
        local_5c = local_5c + 1;
      } while (newhead != list);
      l = merge_block_seqs(block2,block1._4_4_,next,local_5c,userdata,cmp);
      verify_sorted(l,block1._4_4_ + local_5c,userdata,cmp);
      if (block2 == list) {
        list = l;
      }
      block2 = newhead;
    } while (newhead != list);
LAB_0010f476:
    block1._4_4_ = block1._4_4_ << 1;
  } while( true );
}

Assistant:

void raviX_ptrlist_sort(PtrList **plist, void *userdata, int (*cmp)(void *, const void *, const void *))
{
	PtrList *head = *plist, *list = head;
	int blocks = 1;

	assert(N_ == LIST_NODE_NR);
	if (!head)
		return;

	// Sort all the sub-lists
	do {
		array_sort(list->list_, list->nr_, userdata, cmp);
#ifdef PARANOIA
		verify_sorted(list, 1, userdata, cmp);
#endif
		list = list->next_;
	} while (list != head);

	// Merge the damn things together
	while (1) {
		PtrList *block1 = head;

		do {
			PtrList *block2 = block1;
			PtrList *next, *newhead;
			int i;

			for (i = 0; i < blocks; i++) {
				block2 = block2->next_;
				if (block2 == head) {
					if (block1 == head) {
						// BEEN_THERE('A');
						*plist = head;
						return;
					}
					// BEEN_THERE('B');
					goto next_pass;
				}
			}

			next = block2;
			for (i = 0; i < blocks;) {
				next = next->next_;
				i++;
				if (next == head) {
					// BEEN_THERE('C');
					break;
				}
				// BEEN_THERE('D');
			}

			newhead = merge_block_seqs(block1, blocks, block2, i, userdata, cmp);
#ifdef PARANOIA
			verify_sorted(newhead, blocks + i, userdata, cmp);
#endif
			if (block1 == head) {
				// BEEN_THERE('E');
				head = newhead;
			}
			block1 = next;
		} while (block1 != head);
	next_pass:
		blocks <<= 1;
	}
}